

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O2

UINT32 TSS_BuildCommand(TPM_CC cmdCode,TPM_HANDLE *handles,INT32 numHandles,TSS_SESSION **sessions,
                       INT32 numSessions,BYTE *params,INT32 paramsSize,BYTE *cmdBuffer,
                       INT32 bufCapacity)

{
  uint uVar1;
  UINT16 UVar2;
  UINT32 UVar3;
  ulong uVar4;
  bool bVar5;
  BYTE *pAuthSize;
  uint local_5c;
  UINT16 local_56;
  UINT32 local_54;
  uint local_50;
  TPM_CC local_4c;
  BYTE *local_48;
  BYTE *local_40;
  BYTE *local_38;
  
  local_56 = 0x8002 - (sessions == (TSS_SESSION **)0x0);
  UVar3 = 0;
  local_5c = 0;
  if (0xffffff8a < cmdCode - 0x194) {
    local_5c = 0;
    if ((handles != (TPM_HANDLE *)0x0 || numHandles == 0) &&
       (local_5c = UVar3, sessions != (TSS_SESSION **)0x0 || numSessions == 0)) {
      if ((9 < (uint)bufCapacity) &&
         (((cmdBuffer != (BYTE *)0x0 && (params != (BYTE *)0x0 || paramsSize == 0)) &&
          (-1 < bufCapacity)))) {
        local_50 = numSessions;
        local_4c = cmdCode;
        local_48 = params;
        UVar2 = UINT16_Marshal(&local_56,&cmdBuffer,&bufCapacity);
        local_5c = (uint)UVar2;
        local_38 = cmdBuffer;
        UVar2 = UINT32_Marshal(&local_5c,&cmdBuffer,&bufCapacity);
        local_5c = local_5c + UVar2;
        UVar2 = UINT32_Marshal(&local_4c,&cmdBuffer,&bufCapacity);
        local_5c = local_5c + UVar2;
        uVar4 = 0;
        if (0 < numHandles) {
          uVar4 = (ulong)(uint)numHandles;
        }
        while (uVar1 = local_50, bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
          UVar2 = UINT32_Marshal(handles,&cmdBuffer,&bufCapacity);
          local_5c = local_5c + UVar2;
          handles = handles + 1;
        }
        if (0 < (int)local_50) {
          local_40 = cmdBuffer;
          local_54 = 0;
          UVar2 = UINT32_Marshal(&local_54,&cmdBuffer,&bufCapacity);
          local_5c = local_5c + UVar2;
          for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
            UVar2 = TPMS_AUTH_COMMAND_Marshal(&sessions[uVar4]->SessIn,&cmdBuffer,&bufCapacity);
            local_54 = local_54 + UVar2;
          }
          local_5c = local_5c + local_54;
          UINT32_Marshal(&local_54,&local_40,(INT32 *)0x0);
        }
        if (local_48 != (BYTE *)0x0 && paramsSize != 0) {
          UVar2 = BYTE_Array_Marshal(local_48,&cmdBuffer,&bufCapacity,paramsSize);
          local_5c = local_5c + UVar2;
        }
        UINT32_Marshal(&local_5c,&local_38,(INT32 *)0x0);
      }
    }
  }
  return local_5c;
}

Assistant:

UINT32
TSS_BuildCommand(
    TPM_CC           cmdCode,       // IN: Command code
    TPM_HANDLE      *handles,       // IN (opt): Array of handles used by the command
    INT32            numHandles,    // IN: Number of handles in 'handles'
    TSS_SESSION    **sessions,      // IN (opt): Array of sessions
    INT32            numSessions,   // IN: Number of sessions in 'sessions'
    BYTE            *params,        // IN (opt): Marshaled command parameters
    INT32            paramsSize,    // IN: Size of 'params' in bytes
    BYTE            *cmdBuffer,     // OUT: Command buffer ready for sending to TPM
    INT32            bufCapacity    // IN: Capacity of 'cmdBuffer' in bytes
)
{
    UINT32  cmdSize = 0;
    BYTE   *pCmdSize = NULL;
    TPM_ST  tag = sessions ? TPM_ST_SESSIONS : TPM_ST_NO_SESSIONS;

    if ((cmdCode < 0x0000011f || cmdCode > 0x00000193)
        || (!handles && numHandles)
        || (!sessions && numSessions)
        || (!params && paramsSize)
        || (bufCapacity < 0)
        || (!cmdBuffer || (((UINT32)bufCapacity) < STD_RESPONSE_HEADER)))
    {
        return 0;
    }

    //
    // Marshal command header
    //

    cmdSize += TPMI_ST_COMMAND_TAG_Marshal(&tag, &cmdBuffer, &bufCapacity);

    // Do not know the final size of the command buffer yet.
    // Remeber the place to marshal it, and reserve space in the command buffer.
    pCmdSize = cmdBuffer;
    cmdSize += UINT32_Marshal((UINT32*)&cmdSize, &cmdBuffer, &bufCapacity);

    cmdSize += TPM_CC_Marshal(&cmdCode, &cmdBuffer, &bufCapacity);

    //
    // Marshal handles, if any
    //
    for (int i = 0; i < numHandles; i++)
    {
        cmdSize += TPM_HANDLE_Marshal(handles + i, &cmdBuffer, &bufCapacity);
    }
    // cmdSize = 14
    // bufCapacity - 4082

    //
    // Marshal sessions, if any
    //
    if (numSessions > 0)
    {
        // Do not know the size of the authorization area yet.
        // Remeber the place to marshal it, and marshal a placeholder value for now.
        BYTE   *pAuthSize = cmdBuffer; //t-sdks-
        UINT32  authSize = 0;

        // cmdSize - 14
        cmdSize += UINT32_Marshal((UINT32*)&authSize, &cmdBuffer, &bufCapacity);
        // cmdSize - 18

        // Marshal the sessions
        for (int i = 0; i < numSessions; i++)
        {
            authSize += TPMS_AUTH_COMMAND_Marshal(&sessions[i]->SessIn, &cmdBuffer, &bufCapacity);
        }
        // CmdBuffer - zure-devices.net/devices/jebrandoDevice/n1491340412

        // Update total marshaled size
        // 18 += 9;
        cmdSize += authSize;
        // 27

        // And marshal auth area size into the reserved space
        UINT32_Marshal((UINT32*)&authSize, &pAuthSize, NULL);
        // zure-devices.net/devices/jebrandoDevice
    }

    //
    // Marshal parameters, if any
    //
    if (params && paramsSize)
    {
        // 27
        cmdSize += BYTE_Array_Marshal(params, &cmdBuffer, &bufCapacity, paramsSize);
    }

    // Finally marshal total command size into the reserved space
    UINT32_Marshal((UINT32*)&cmdSize, &pCmdSize, NULL);

    return cmdSize;
}